

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O3

char * imap_atom(char *str)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  size_t sVar5;
  char *pcVar6;
  byte *pbVar7;
  char *pcVar8;
  char cVar9;
  long lVar10;
  long lVar11;
  
  if (str == (char *)0x0) {
    return (char *)0x0;
  }
  lVar11 = 0;
  lVar10 = 0;
  bVar4 = false;
  pbVar7 = (byte *)str;
  do {
    bVar1 = *pbVar7;
    if (bVar1 < 0x22) {
      if (bVar1 == 0x20) {
        bVar4 = true;
      }
      else if (bVar1 == 0) {
        bVar2 = lVar11 == 0;
        bVar3 = lVar10 == 0;
        if ((bVar2 && bVar3) && !bVar4) {
          pcVar6 = (*Curl_cstrdup)(str);
          return pcVar6;
        }
        sVar5 = strlen(str);
        lVar10 = lVar10 + lVar11 + (ulong)(byte)((bVar2 && bVar3) | bVar4) * 2;
        pcVar6 = (char *)(*Curl_cmalloc)(sVar5 + lVar10 + 1);
        if (pcVar6 == (char *)0x0) {
          return (char *)0x0;
        }
        lVar10 = lVar10 + sVar5;
        pcVar8 = pcVar6;
        if ((!bVar2 || !bVar3) && bVar4 == false) goto LAB_0049b50c;
        *pcVar6 = '\"';
        pcVar6[lVar10 + -1] = '\"';
        do {
          pcVar8 = pcVar8 + 1;
LAB_0049b50c:
          cVar9 = *str;
          if ((cVar9 == '\"') || (cVar9 == '\\')) {
            *pcVar8 = '\\';
            pcVar8 = pcVar8 + 1;
            cVar9 = *str;
          }
          else if (cVar9 == '\0') {
            pcVar6[lVar10] = '\0';
            return pcVar6;
          }
          *pcVar8 = cVar9;
          str = str + 1;
        } while( true );
      }
    }
    else if (bVar1 == 0x22) {
      lVar10 = lVar10 + 1;
    }
    else if (bVar1 == 0x5c) {
      lVar11 = lVar11 + 1;
    }
    pbVar7 = pbVar7 + 1;
  } while( true );
}

Assistant:

static char *imap_atom(const char *str)
{
  const char *p1;
  char *p2;
  size_t backsp_count = 0;
  size_t quote_count = 0;
  bool space_exists = FALSE;
  size_t newlen = 0;
  char *newstr = NULL;

  if(!str)
    return NULL;

  /* Count any unescaped characters */
  p1 = str;
  while(*p1) {
    if(*p1 == '\\')
      backsp_count++;
    else if(*p1 == '"')
      quote_count++;
    else if(*p1 == ' ')
      space_exists = TRUE;

    p1++;
  }

  /* Does the input contain any unescaped characters? */
  if(!backsp_count && !quote_count && !space_exists)
    return strdup(str);

  /* Calculate the new string length */
  newlen = strlen(str) + backsp_count + quote_count + (space_exists ? 2 : 0);

  /* Allocate the new string */
  newstr = (char *) malloc((newlen + 1) * sizeof(char));
  if(!newstr)
    return NULL;

  /* Surround the string in quotes if necessary */
  p2 = newstr;
  if(space_exists) {
    newstr[0] = '"';
    newstr[newlen - 1] = '"';
    p2++;
  }

  /* Copy the string, escaping backslash and quote characters along the way */
  p1 = str;
  while(*p1) {
    if(*p1 == '\\' || *p1 == '"') {
      *p2 = '\\';
      p2++;
    }

   *p2 = *p1;

    p1++;
    p2++;
  }

  /* Terminate the string */
  newstr[newlen] = '\0';

  return newstr;
}